

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O0

void JsrtDebugUtils::AddSourceToObject(DynamicObject *object,Utf8SourceInfo *utf8SourceInfo)

{
  bool bVar1;
  Memory *this;
  char16_t *pcVar2;
  size_t len;
  ScriptContext *pSVar3;
  JsrtDebugPropertyId local_94;
  JsrtDebugPropertyId local_90;
  DecodeOptions local_8c;
  size_t sStack_88;
  DecodeOptions options;
  size_t cbLength;
  LPCUTF8 source;
  code *local_68;
  undefined8 local_60;
  TrackAllocData local_58;
  undefined1 local_30 [8];
  AutoArrayPtr<char16_t> sourceContent;
  int32 cchLength;
  Utf8SourceInfo *utf8SourceInfo_local;
  DynamicObject *object_local;
  
  sourceContent.m_elementCount._4_4_ = Js::Utf8SourceInfo::GetCchLength(utf8SourceInfo);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&char16_t::typeinfo,0,
             (long)(int)(sourceContent.m_elementCount._4_4_ + 1),
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
             ,0x61);
  this = (Memory *)Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_58)
  ;
  local_68 = Memory::HeapAllocator::NoThrowAlloc;
  local_60 = 0;
  pcVar2 = Memory::AllocateArray<Memory::HeapAllocator,char16_t,true>
                     (this,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,
                      (long)(int)(sourceContent.m_elementCount._4_4_ + 1));
  AutoArrayPtr<char16_t>::AutoArrayPtr
            ((AutoArrayPtr<char16_t> *)local_30,pcVar2,
             (long)(int)(sourceContent.m_elementCount._4_4_ + 1));
  pcVar2 = BasePtr::operator_cast_to_char16_t_((BasePtr *)local_30);
  if (pcVar2 == (char16_t *)0x0) {
    JsrtDebugPropertyId::JsrtDebugPropertyId(&local_94,source);
    pSVar3 = Js::Utf8SourceInfo::GetScriptContext(utf8SourceInfo);
    AddPropertyToObject(object,local_94,L"",1,pSVar3);
  }
  else {
    cbLength = (size_t)Js::Utf8SourceInfo::GetSource(utf8SourceInfo,(char16 *)0x0);
    sStack_88 = Js::Utf8SourceInfo::GetCbLength(utf8SourceInfo,(char16 *)0x0);
    bVar1 = Js::Utf8SourceInfo::IsCesu8(utf8SourceInfo);
    local_8c = (DecodeOptions)bVar1;
    pcVar2 = BasePtr::operator_cast_to_char16_t_((BasePtr *)local_30);
    utf8::DecodeUnitsIntoAndNullTerminate
              (pcVar2,(LPCUTF8 *)&cbLength,(LPCUTF8)(cbLength + sStack_88),local_8c,(bool *)0x0);
    JsrtDebugPropertyId::JsrtDebugPropertyId(&local_90,source);
    pcVar2 = BasePtr::operator_cast_to_char16_t_((BasePtr *)local_30);
    len = (size_t)(int)sourceContent.m_elementCount._4_4_;
    pSVar3 = Js::Utf8SourceInfo::GetScriptContext(utf8SourceInfo);
    AddPropertyToObject(object,local_90,pcVar2,len,pSVar3);
  }
  AutoArrayPtr<char16_t>::~AutoArrayPtr((AutoArrayPtr<char16_t> *)local_30);
  return;
}

Assistant:

void JsrtDebugUtils::AddSourceToObject(Js::DynamicObject * object, Js::Utf8SourceInfo * utf8SourceInfo)
{
    int32 cchLength = utf8SourceInfo->GetCchLength();
    AutoArrayPtr<char16> sourceContent(HeapNewNoThrowArray(char16, cchLength + 1), cchLength + 1);
    if (sourceContent != nullptr)
    {
        LPCUTF8 source = utf8SourceInfo->GetSource();
        size_t cbLength = utf8SourceInfo->GetCbLength();
        utf8::DecodeOptions options = utf8SourceInfo->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
        utf8::DecodeUnitsIntoAndNullTerminate(sourceContent, source, source + cbLength, options);
        JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::source, sourceContent, cchLength, utf8SourceInfo->GetScriptContext());
    }
    else
    {
        JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::source, _u(""), 1, utf8SourceInfo->GetScriptContext());
    }
}